

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall
CUI::DoPopupMenu(CUI *this,int X,int Y,int Width,int Height,void *pContext,
                _func_bool_void_ptr_CUIRect *pfnFunc,int Corners)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                 ,0x337,(uint)(this->m_NumPopupMenus < 8),"max popup menus exceeded");
  uVar1 = this->m_pGraphics->m_ScreenWidth;
  uVar2 = this->m_pGraphics->m_ScreenHeight;
  fVar4 = ((float)(int)uVar1 / (float)(int)uVar2) * 600.0;
  (this->m_Screen).h = 600.0;
  (this->m_Screen).w = fVar4;
  uVar3 = this->m_NumPopupMenus;
  uVar5 = (int)((uint)(fVar4 < (float)(Width + X)) << 0x1f) >> 0x1f;
  uVar6 = (int)((uint)(600 < Height + Y) << 0x1f) >> 0x1f;
  this->m_aPopupMenus[uVar3].m_Rect.x =
       (float)(int)(~uVar5 & X | (int)(fVar4 - (float)Width) & uVar5);
  this->m_aPopupMenus[uVar3].m_Rect.y =
       (float)(int)(~uVar6 & Y | (int)(600.0 - (float)Height) & uVar6);
  this->m_aPopupMenus[uVar3].m_Rect.w = (float)Width;
  this->m_aPopupMenus[uVar3].m_Rect.h = (float)Height;
  this->m_aPopupMenus[uVar3].m_Corners = Corners;
  this->m_aPopupMenus[uVar3].m_pContext = pContext;
  this->m_aPopupMenus[uVar3].m_pfnFunc = pfnFunc;
  this->m_aPopupMenus[uVar3].m_New = true;
  this->m_NumPopupMenus = uVar3 + 1;
  return;
}

Assistant:

void CUI::DoPopupMenu(int X, int Y, int Width, int Height, void *pContext, bool (*pfnFunc)(void *pContext, CUIRect View), int Corners)
{
	dbg_assert(m_NumPopupMenus < MAX_POPUP_MENUS, "max popup menus exceeded");

	if(X + Width > Screen()->w)
		X = Screen()->w - Width;
	if(Y + Height > Screen()->h)
		Y = Screen()->h - Height;

	m_aPopupMenus[m_NumPopupMenus].m_Rect.x = X;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.y = Y;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.w = Width;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.h = Height;
	m_aPopupMenus[m_NumPopupMenus].m_Corners = Corners;
	m_aPopupMenus[m_NumPopupMenus].m_pContext = pContext;
	m_aPopupMenus[m_NumPopupMenus].m_pfnFunc = pfnFunc;
	m_aPopupMenus[m_NumPopupMenus].m_New = true;
	m_NumPopupMenus++;
}